

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O1

void __thiscall
ImplDispatchTest_AES_single_block_Test::TestBody(ImplDispatchTest_AES_single_block_Test *this)

{
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  AES_KEY key;
  allocator_type local_171;
  vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> local_170
  ;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  pair<unsigned_long,_bool> local_130;
  undefined8 local_120;
  byte local_118;
  AES_KEY local_10c;
  
  AES_set_encrypt_key("",0x80,&local_10c);
  local_130.first = 1;
  local_130.second = (this->super_ImplDispatchTest).aesni_;
  local_118 = 0;
  if ((this->super_ImplDispatchTest).ssse3_ != false) {
    local_118 = local_130.second ^ 1;
  }
  local_120 = 4;
  __l._M_len = 2;
  __l._M_array = &local_130;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector(&local_170,__l,&local_171);
  local_158._8_8_ = 0;
  pcStack_140 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:155:7)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:155:7)>
              ::_M_manager;
  local_158._M_unused._M_object = &local_10c;
  ImplDispatchTest::AssertFunctionsHit
            (&this->super_ImplDispatchTest,&local_170,(function<void_()> *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if (local_170.
      super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.
                    super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170.
                          super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.
                          super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AES_single_block) {
  AES_KEY key;
  static const uint8_t kZeros[16] = {0};
  AES_set_encrypt_key(kZeros, sizeof(kZeros) * 8, &key);

  AssertFunctionsHit(
      {
          {kFlag_aes_hw_encrypt, aesni_},
          {kFlag_vpaes_encrypt, ssse3_ && !aesni_},
      },
      [&key] {
        uint8_t in[AES_BLOCK_SIZE] = {0};
        uint8_t out[AES_BLOCK_SIZE];
        AES_encrypt(in, out, &key);
      });
}